

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createPthreadJoinCall
          (LLVMReadWriteGraphBuilder *this,CallInst *CInst)

{
  RWNode *node;
  RWNode *local_28;
  CallInst *local_20;
  
  local_20 = CInst;
  local_28 = createUnknownCall(this,CInst);
  std::
  _Rb_tree<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>,std::_Select1st<std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>>,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>>>
  ::_M_emplace_unique<llvm::CallInst_const*&,dg::dda::RWNode*&>
            ((_Rb_tree<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>,std::_Select1st<std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>>,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>>>
              *)&this->threadJoinCalls,&local_20,&local_28);
  return local_28;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createPthreadJoinCall(const llvm::CallInst *CInst) {
    // TODO later change this to create join node and set data correctly
    // we need just to create one node;
    // undefined call is overapproximation, so its ok
    RWNode *node = createUnknownCall(CInst);
    threadJoinCalls.emplace(CInst, node);
    return node;
}